

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverTable.hpp
# Opt level: O0

void __thiscall trt_pose::parse::utils::CoverTable::CoverTable(CoverTable *this,int nrows,int ncols)

{
  int ncols_local;
  int nrows_local;
  CoverTable *this_local;
  
  this->nrows = nrows;
  this->ncols = ncols;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->rows);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->cols);
  std::vector<bool,_std::allocator<bool>_>::resize(&this->rows,(long)nrows,false);
  std::vector<bool,_std::allocator<bool>_>::resize(&this->cols,(long)ncols,false);
  return;
}

Assistant:

CoverTable(int nrows, int ncols) : nrows(nrows), ncols(ncols)
  {
    rows.resize(nrows);
    cols.resize(ncols);
  }